

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_5450::xmlEscape
          (string *__return_storage_ptr__,anon_unknown_dwarf_5450 *this,string *source)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&source->_M_dataplus);
  uVar2 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x10f060,0);
  do {
    if (uVar2 == 0xffffffffffffffff) {
      return (string *)0xffffffffffffffff;
    }
    cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[uVar2];
    pcVar3 = "&gt;";
    if (cVar1 == '>') {
LAB_00108d5d:
      std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(char *)0x1,(ulong)pcVar3);
    }
    else if (cVar1 == '<') {
      pcVar3 = "&lt;";
      goto LAB_00108d5d;
    }
    uVar2 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x10f060,0);
  } while( true );
}

Assistant:

std::string xmlEscape(std::string const& source)
    {
        string result = source;
        size_t pos = result.find_first_of("<>");
        while (pos != string::npos)
        {
            if (result[pos] == '<')
                result.replace(pos, 1, "&lt;");
            else if (result[pos] == '>')
                result.replace(pos, 1, "&gt;");
            pos = result.find_first_of("<>");
        }

        return result;
    }